

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

MessageBuilder * __thiscall el::base::MessageBuilder::operator<<(MessageBuilder *this,wchar_t *msg)

{
  char *pcVar1;
  
  if (msg == (wchar_t *)0x0) {
    pcVar1 = "nullptr";
  }
  else {
    pcVar1 = utils::Str::wcharPtrToCharPtr(msg);
    std::operator<<((ostream *)&this->m_logger->field_0x50,pcVar1);
    free(pcVar1);
    if ((*(byte *)(elStorage + 0x19) & 0x20) == 0) {
      return this;
    }
    pcVar1 = " ";
  }
  std::operator<<((ostream *)&this->m_logger->field_0x50,pcVar1);
  return this;
}

Assistant:

MessageBuilder& MessageBuilder::operator<<(const wchar_t* msg) {
  if (msg == nullptr) {
    m_logger->stream() << base::consts::kNullPointer;
    return *this;
  }
#  if defined(ELPP_UNICODE)
  m_logger->stream() << msg;
#  else
  char* buff_ = base::utils::Str::wcharPtrToCharPtr(msg);
  m_logger->stream() << buff_;
  free(buff_);
#  endif
  if (ELPP->hasFlag(LoggingFlag::AutoSpacing)) {
    m_logger->stream() << " ";
  }
  return *this;
}